

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O2

void __thiscall pageAnalyzer::pageAnalyzer(pageAnalyzer *this,string *inputPage)

{
  (this->inputPage)._M_dataplus._M_p = (pointer)&(this->inputPage).field_2;
  (this->inputPage)._M_string_length = 0;
  (this->inputPage).field_2._M_local_buf[0] = '\0';
  (this->pageContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pageContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pageContent).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  decomposePageContent(this);
  return;
}

Assistant:

pageAnalyzer::pageAnalyzer(const std::string &inputPage)
{
    this->inputPage = inputPage;
    this->decomposePageContent();
}